

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

xmlChar * xmlSchemaCollapseString(xmlChar *value)

{
  xmlChar *pxVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  
  if (value == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  lVar2 = 0;
  while (((ulong)value[lVar2] < 0x21 && ((0x100002600U >> ((ulong)value[lVar2] & 0x3f) & 1) != 0)))
  {
    lVar2 = lVar2 + 1;
  }
  pbVar4 = value + lVar2;
  iVar5 = 0;
  pbVar3 = pbVar4;
LAB_001aedb4:
  bVar6 = *pbVar3;
  if (bVar6 < 0x20) {
    if (bVar6 - 9 < 2) goto LAB_001aee01;
    if (bVar6 == 0) {
      iVar5 = 0;
LAB_001aee01:
      if (iVar5 == 0) {
        pbVar8 = pbVar3 + -1;
        pbVar9 = pbVar3;
        if (pbVar4 < pbVar8) {
          do {
            if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))
            break;
            pbVar8 = pbVar8 + -1;
          } while (pbVar4 < pbVar8);
          pbVar9 = pbVar8 + 1;
        }
        if ((lVar2 == 0) && (pbVar3 == pbVar9)) {
          return (xmlChar *)0x0;
        }
        pxVar1 = xmlStrndup(pbVar4,((int)pbVar9 - (int)value) - (int)lVar2);
        return pxVar1;
      }
      pxVar1 = xmlStrdup(pbVar4);
      if (pxVar1 == (xmlChar *)0x0) {
        return (xmlChar *)0x0;
      }
      pbVar3 = pxVar1 + iVar5;
      pbVar4 = pbVar3;
      while( true ) {
        bVar6 = *pbVar3;
        uVar7 = (ulong)bVar6;
        if (0x20 < uVar7) break;
        if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
          if (uVar7 == 0) {
            *pbVar4 = 0;
            return pxVar1;
          }
          break;
        }
        do {
          pbVar3 = pbVar3 + 1;
          uVar7 = (ulong)*pbVar3;
          if (0x20 < uVar7) goto LAB_001aee41;
        } while ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0);
        if (uVar7 != 0) {
LAB_001aee41:
          bVar6 = 0x20;
LAB_001aee4e:
          *pbVar4 = bVar6;
          pbVar4 = pbVar4 + 1;
        }
      }
      pbVar3 = pbVar3 + 1;
      goto LAB_001aee4e;
    }
    if (bVar6 == 0xd) goto LAB_001aee01;
  }
  else if (((bVar6 == 0x20) && ((ulong)pbVar3[1] < 0x21)) &&
          ((0x100002600U >> ((ulong)pbVar3[1] & 0x3f) & 1) != 0)) goto LAB_001aee01;
  pbVar3 = pbVar3 + 1;
  iVar5 = iVar5 + 1;
  goto LAB_001aedb4;
}

Assistant:

xmlChar *
xmlSchemaCollapseString(const xmlChar *value) {
    const xmlChar *start = value, *end, *f;
    xmlChar *g;
    int col = 0;

    if (value == NULL) return(NULL);
    while ((*start != 0) && (IS_BLANK_CH(*start))) start++;
    end = start;
    while (*end != 0) {
	if ((*end == ' ') && (IS_BLANK_CH(end[1]))) {
	    col = end - start;
	    break;
	} else if ((*end == 0xa) || (*end == 0x9) || (*end == 0xd)) {
	    col = end - start;
	    break;
	}
	end++;
    }
    if (col == 0) {
	f = end;
	end--;
	while ((end > start) && (IS_BLANK_CH(*end))) end--;
	end++;
	if ((start == value) && (f == end)) return(NULL);
	return(xmlStrndup(start, end - start));
    }
    start = xmlStrdup(start);
    if (start == NULL) return(NULL);
    g = (xmlChar *) (start + col);
    end = g;
    while (*end != 0) {
	if (IS_BLANK_CH(*end)) {
	    end++;
	    while (IS_BLANK_CH(*end)) end++;
	    if (*end != 0)
		*g++ = ' ';
	} else
	    *g++ = *end++;
    }
    *g = 0;
    return((xmlChar *) start);
}